

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlURIPtr xmlParseURI(char *str)

{
  int iVar1;
  xmlURIPtr uri;
  
  if ((str != (char *)0x0) && (uri = xmlCreateURI(), uri != (xmlURIPtr)0x0)) {
    iVar1 = xmlParse3986URIReference(uri,str);
    if (iVar1 == 0) {
      return uri;
    }
    xmlFreeURI(uri);
  }
  return (xmlURIPtr)0x0;
}

Assistant:

xmlURIPtr
xmlParseURI(const char *str) {
    xmlURIPtr uri;
    int ret;

    if (str == NULL)
	return(NULL);
    uri = xmlCreateURI();
    if (uri != NULL) {
	ret = xmlParse3986URIReference(uri, str);
        if (ret) {
	    xmlFreeURI(uri);
	    return(NULL);
	}
    }
    return(uri);
}